

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD2Loader.cpp
# Opt level: O0

void __thiscall Assimp::MD2Importer::SetupProperties(MD2Importer *this,Importer *pImp)

{
  uint uVar1;
  Importer *pImp_local;
  MD2Importer *this_local;
  
  uVar1 = Importer::GetPropertyInteger(pImp,"IMPORT_MD2_KEYFRAME",-1);
  this->configFrameID = uVar1;
  if (this->configFrameID == 0xffffffff) {
    uVar1 = Importer::GetPropertyInteger(pImp,"IMPORT_GLOBAL_KEYFRAME",0);
    this->configFrameID = uVar1;
  }
  return;
}

Assistant:

void MD2Importer::SetupProperties(const Importer* pImp)
{
    // The
    // AI_CONFIG_IMPORT_MD2_KEYFRAME option overrides the
    // AI_CONFIG_IMPORT_GLOBAL_KEYFRAME option.
    configFrameID = pImp->GetPropertyInteger(AI_CONFIG_IMPORT_MD2_KEYFRAME,-1);
    if(static_cast<unsigned int>(-1) == configFrameID){
        configFrameID = pImp->GetPropertyInteger(AI_CONFIG_IMPORT_GLOBAL_KEYFRAME,0);
    }
}